

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  bool bVar1;
  float fVar2;
  ImGuiDir local_34;
  undefined1 auStack_30 [4];
  ImGuiDir clip_dir;
  ImRect bb_rel;
  ImGuiContext *g;
  ImGuiNavMoveFlags move_flags_local;
  ImGuiWindow *window_local;
  
  bb_rel.Max = (ImVec2)GImGui;
  if ((((GImGui->NavWindow == window) && (bVar1 = NavMoveRequestButNoResultYet(), bVar1)) &&
      (*(int *)((long)bb_rel.Max + 0x1bfc) == 0)) && (*(int *)((long)bb_rel.Max + 0x1bd0) == 0)) {
    if (move_flags == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1fc0,
                    "void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *, ImGuiNavMoveFlags)");
    }
    _auStack_30 = window->NavRectRel[0].Min;
    bb_rel.Min = window->NavRectRel[0].Max;
    local_34 = *(ImGuiDir *)((long)bb_rel.Max + 0x1c00);
    if ((*(int *)((long)bb_rel.Max + 0x1c00) == 0) && ((move_flags & 5U) != 0)) {
      fVar2 = (window->WindowPadding).x;
      fVar2 = ImMax<float>((window->SizeFull).x,fVar2 + fVar2 + (window->ContentSize).x);
      fVar2 = fVar2 - (window->Scroll).x;
      bb_rel.Min.x = fVar2;
      auStack_30 = (undefined1  [4])fVar2;
      if ((move_flags & 4U) != 0) {
        fVar2 = ImRect::GetHeight((ImRect *)auStack_30);
        ImRect::TranslateY((ImRect *)auStack_30,-fVar2);
        local_34 = 2;
      }
      NavMoveRequestForward
                (*(ImGuiDir *)((long)bb_rel.Max + 0x1c00),local_34,(ImRect *)auStack_30,move_flags);
    }
    if ((*(int *)((long)bb_rel.Max + 0x1c00) == 1) && ((move_flags & 5U) != 0)) {
      fVar2 = (window->Scroll).x;
      bb_rel.Min = (ImVec2)(CONCAT44(bb_rel.Min.y,fVar2) ^ 0x80000000);
      _auStack_30 = (ImVec2)(CONCAT44(clip_dir,fVar2) ^ 0x80000000);
      if ((move_flags & 4U) != 0) {
        fVar2 = ImRect::GetHeight((ImRect *)auStack_30);
        ImRect::TranslateY((ImRect *)auStack_30,fVar2);
        local_34 = 3;
      }
      NavMoveRequestForward
                (*(ImGuiDir *)((long)bb_rel.Max + 0x1c00),local_34,(ImRect *)auStack_30,move_flags);
    }
    if ((*(int *)((long)bb_rel.Max + 0x1c00) == 2) && ((move_flags & 10U) != 0)) {
      fVar2 = (window->WindowPadding).y;
      fVar2 = ImMax<float>((window->SizeFull).y,fVar2 + fVar2 + (window->ContentSize).y);
      fVar2 = fVar2 - (window->Scroll).y;
      bb_rel.Min.y = fVar2;
      clip_dir = (ImGuiDir)fVar2;
      if ((move_flags & 8U) != 0) {
        fVar2 = ImRect::GetWidth((ImRect *)auStack_30);
        ImRect::TranslateX((ImRect *)auStack_30,-fVar2);
        local_34 = 0;
      }
      NavMoveRequestForward
                (*(ImGuiDir *)((long)bb_rel.Max + 0x1c00),local_34,(ImRect *)auStack_30,move_flags);
    }
    if ((*(int *)((long)bb_rel.Max + 0x1c00) == 3) && ((move_flags & 10U) != 0)) {
      fVar2 = (window->Scroll).y;
      bb_rel.Min = (ImVec2)(CONCAT44(fVar2,bb_rel.Min.x) ^ 0x8000000000000000);
      _auStack_30 = (ImVec2)(CONCAT44(fVar2,auStack_30) ^ 0x8000000000000000);
      if ((move_flags & 8U) != 0) {
        fVar2 = ImRect::GetWidth((ImRect *)auStack_30);
        ImRect::TranslateX((ImRect *)auStack_30,fVar2);
        local_34 = 1;
      }
      NavMoveRequestForward
                (*(ImGuiDir *)((long)bb_rel.Max + 0x1c00),local_34,(ImRect *)auStack_30,move_flags);
    }
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->ContentSize.x + window->WindowPadding.x * 2.0f) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->ContentSize.y + window->WindowPadding.y * 2.0f) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}